

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

basic_string<char,_eastl::allocator> *
eastl::
copy_backward_chooser<eastl::basic_string<char,eastl::allocator>*,eastl::basic_string<char,eastl::allocator>*>
          (basic_string<char,_eastl::allocator> *first,basic_string<char,_eastl::allocator> *last,
          basic_string<char,_eastl::allocator> *result)

{
  basic_string<char,_eastl::allocator> *pbVar1;
  bool bHasTrivialCopy;
  basic_string<char,_eastl::allocator> *result_local;
  basic_string<char,_eastl::allocator> *last_local;
  basic_string<char,_eastl::allocator> *first_local;
  
  pbVar1 = copy_backward_impl<false,std::random_access_iterator_tag>::
           do_copy<eastl::basic_string<char,eastl::allocator>*,eastl::basic_string<char,eastl::allocator>*>
                     (first,last,result);
  return pbVar1;
}

Assistant:

inline OutputIterator
    copy_backward_chooser(InputIterator first, InputIterator last, OutputIterator result)
    {
        typedef typename eastl::iterator_traits<InputIterator>::iterator_category IC;
        typedef typename eastl::iterator_traits<InputIterator>::value_type        value_type_input;
        typedef typename eastl::iterator_traits<OutputIterator>::value_type       value_type_output;

        const bool bHasTrivialCopy = type_and<has_trivial_assign<value_type_input>::value, 
                                              is_pointer<InputIterator>::value,
                                              is_pointer<OutputIterator>::value,
                                              is_same<value_type_input, value_type_output>::value>::value;

        return eastl::copy_backward_impl<bHasTrivialCopy, IC>::do_copy(first, last, result);
    }